

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_rtree.cpp
# Opt level: O3

bool __thiscall
ON_RTree::Search(ON_RTree *this,ON_RTreeCapsule *a_capsule,
                _func_bool_void_ptr_ON__INT_PTR *a_resultCallback,void *a_context)

{
  bool bVar1;
  ON_RTreeSearchResultCallback result;
  ON_RTreeSearchResultCallback local_10;
  
  if (a_capsule == (ON_RTreeCapsule *)0x0 || this->m_root == (ON_RTreeNode *)0x0) {
    return false;
  }
  local_10.m_context = a_context;
  local_10.m_resultCallback = a_resultCallback;
  bVar1 = SearchHelper(this->m_root,a_capsule,&local_10);
  return bVar1;
}

Assistant:

bool ON_RTree::Search( 
  struct ON_RTreeCapsule* a_capsule,
  bool ON_CALLBACK_CDECL a_resultCallback(void* a_context, ON__INT_PTR a_id),
  void* a_context
  ) const
{
  
  if ( 0 == m_root || 0 == a_capsule )
    return false;

  ON_RTreeSearchResultCallback result;
  result.m_context = a_context;
  result.m_resultCallback = a_resultCallback;

  return SearchHelper(m_root, a_capsule, result);
}